

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<Qt::DayOfWeek>::reallocate
          (QPodArrayOps<Qt::DayOfWeek> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<Qt::DayOfWeek>_*,_Qt::DayOfWeek_*> pVar1;
  
  pVar1 = QTypedArrayData<Qt::DayOfWeek>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<Qt::DayOfWeek>).d,
                     (this->super_QArrayDataPointer<Qt::DayOfWeek>).ptr,alloc,option);
  if (pVar1.second != (DayOfWeek *)0x0) {
    (this->super_QArrayDataPointer<Qt::DayOfWeek>).d = pVar1.first;
    (this->super_QArrayDataPointer<Qt::DayOfWeek>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }